

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::ComputeCacheTestInstance::ComputeCacheTestInstance
          (ComputeCacheTestInstance *this,Context *context,CacheTestParam *param)

{
  Move<vk::Handle<(vk::HandleType)18>_> *local_118;
  Move<vk::Handle<(vk::HandleType)16>_> *local_f8;
  Move<vk::Handle<(vk::HandleType)22>_> *local_d8;
  Move<vk::Handle<(vk::HandleType)19>_> *local_b8;
  Move<vk::Handle<(vk::HandleType)21>_> *local_98;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_78;
  Move<vk::Handle<(vk::HandleType)8>_> *local_58;
  CacheTestParam *param_local;
  Context *context_local;
  ComputeCacheTestInstance *this_local;
  
  CacheTestInstance::CacheTestInstance(&this->super_CacheTestInstance,context,param);
  (this->super_CacheTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__ComputeCacheTestInstance_0165ff10;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move(&this->m_inputBuf);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_inputBufferAlloc);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::Move(&this->m_computeShaderModule);
  local_58 = this->m_outputBuf;
  do {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move(local_58);
    local_58 = local_58 + 1;
  } while (local_58 != (Move<vk::Handle<(vk::HandleType)8>_> *)this->m_outputBufferAlloc);
  local_78 = this->m_outputBufferAlloc;
  do {
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr(local_78);
    local_78 = local_78 + 1;
  } while ((Move<vk::Handle<(vk::HandleType)21>_> *)local_78 != this->m_descriptorPool);
  local_98 = this->m_descriptorPool;
  do {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::Move(local_98);
    local_98 = local_98 + 1;
  } while ((Move<vk::Handle<(vk::HandleType)19>_> *)local_98 != this->m_descriptorSetLayout);
  local_b8 = this->m_descriptorSetLayout;
  do {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::Move(local_b8);
    local_b8 = local_b8 + 1;
  } while (local_b8 != (Move<vk::Handle<(vk::HandleType)19>_> *)this->m_descriptorSet);
  local_d8 = this->m_descriptorSet;
  do {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::Move(local_d8);
    local_d8 = local_d8 + 1;
  } while ((Move<vk::Handle<(vk::HandleType)16>_> *)local_d8 != this->m_pipelineLayout);
  local_f8 = this->m_pipelineLayout;
  do {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::Move(local_f8);
    local_f8 = local_f8 + 1;
  } while (local_f8 != (Move<vk::Handle<(vk::HandleType)16>_> *)this->m_pipeline);
  local_118 = this->m_pipeline;
  do {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::Move(local_118);
    local_118 = local_118 + 1;
  } while ((ComputeCacheTestInstance *)local_118 != this + 1);
  buildBuffers(this);
  buildDescriptorSets(this,0);
  buildDescriptorSets(this,1);
  buildShader(this);
  buildPipeline(this,0);
  buildPipeline(this,1);
  return;
}

Assistant:

ComputeCacheTestInstance::ComputeCacheTestInstance (Context&              context,
													const CacheTestParam*  param)
	: CacheTestInstance (context, param)
{
	buildBuffers();

	buildDescriptorSets(PIPELINE_CACHE_NDX_NO_CACHE);

	buildDescriptorSets(PIPELINE_CACHE_NDX_CACHED);

	buildShader();

	buildPipeline(PIPELINE_CACHE_NDX_NO_CACHE);

	buildPipeline(PIPELINE_CACHE_NDX_CACHED);
}